

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.c
# Opt level: O2

void search_tests(char *name,test **matched,int *n)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  test *ptVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  
  iVar7 = 0;
  uVar2 = test_count;
  if (test_count < 1) {
    uVar2 = 0;
  }
  uVar8 = (ulong)uVar2;
  ptVar6 = tests;
  do {
    bVar9 = uVar8 == 0;
    uVar8 = uVar8 - 1;
    if (bVar9) {
      *n = iVar7;
      return;
    }
    pcVar1 = ptVar6->suite;
    sVar4 = strlen(pcVar1);
    iVar3 = strncmp(name,pcVar1,sVar4);
    if (iVar3 == 0) {
LAB_001025c2:
      lVar5 = (long)iVar7;
      iVar7 = iVar7 + 1;
      matched[lVar5] = ptVar6;
    }
    else {
      pcVar1 = ptVar6->name;
      sVar4 = strlen(pcVar1);
      iVar3 = strncmp(name,pcVar1,sVar4);
      if (iVar3 == 0) goto LAB_001025c2;
    }
    ptVar6 = ptVar6 + 1;
  } while( true );
}

Assistant:

void search_tests(const char *name, struct test **matched, int *n){
  int j = 0;
  for(int i=0; i<test_count; ++i){
    if(strncmp(name, tests[i].suite, strlen(tests[i].suite)) == 0
       || strncmp(name, tests[i].name, strlen(tests[i].name)) == 0)
      matched[j++] = &tests[i];
  }
  *n = j;
}